

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall Arguments::parse(Arguments *this,int argc,char **argv)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  
  if (1 < argc) {
    uVar7 = 1;
    do {
      pcVar3 = argv[uVar7];
      cVar1 = *pcVar3;
      pcVar4 = pcVar3;
      cVar2 = cVar1;
      while (cVar2 != '\0') {
        cVar2 = pcVar4[1];
        pcVar4 = pcVar4 + 1;
      }
      pcVar5 = pcVar3;
      pcVar6 = pcVar3;
      if ((((long)pcVar4 - (long)pcVar3 == 2) && (*pcVar3 == '-')) && (pcVar3[1] == 'c')) {
        this->codegen = CodegenC::codegen;
      }
      else {
        while (cVar1 != '\0') {
          cVar1 = pcVar6[1];
          pcVar5 = pcVar5 + 1;
          pcVar6 = pcVar6 + 1;
        }
        if ((long)pcVar5 - (long)pcVar3 == 3) {
          lVar8 = 0;
          do {
            if (pcVar3[lVar8] != "-js"[lVar8]) goto LAB_0010c6dc;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          this->codegen = CodegenJS::codegen;
        }
        else {
LAB_0010c6dc:
          this->source_path = pcVar3;
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)argc);
  }
  return;
}

Assistant:

void parse(int argc, char** argv) {
		for (int i = 1; i < argc; ++i) {
			if (StringView(argv[i]) == "-c") codegen = CodegenC::codegen;
			else if (StringView(argv[i]) == "-js") codegen = CodegenJS::codegen;
			else source_path = argv[i];
		}
	}